

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

int nonius::run_it(configuration *cfg)

{
  reporter_registry *in_stack_00000010;
  exception *e;
  configuration *in_stack_00000020;
  configuration *in_stack_fffffffffffffe80;
  configuration *in_stack_fffffffffffffea8;
  configuration *in_stack_fffffffffffffeb0;
  
  configuration::configuration(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  global_benchmark_registry();
  global_reporter_registry_abi_cxx11_();
  go<std::chrono::_V2::system_clock>(in_stack_00000020,(benchmark_registry *)e,in_stack_00000010);
  configuration::~configuration(in_stack_fffffffffffffe80);
  return 0;
}

Assistant:

inline int run_it(configuration cfg) {
        try {
            nonius::go(cfg);
        } catch(...) {
            std::cerr << "PANIC: clock is on fire\n";
            try {
                throw;
            } catch(std::exception const& e) {
                std::cerr << "  " << e.what() << "\n";
            } catch(...) {}
            return 23;
        }
        return 0;
    }